

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,duckdb::string_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  value_type vVar6;
  sel_t *psVar7;
  const_reference pvVar8;
  uint uVar9;
  idx_t iVar10;
  idx_t iVar11;
  idx_t iVar12;
  uchar **rhs_locations;
  idx_t iVar13;
  bool bVar14;
  SelectionVector *lhs_sel;
  anon_union_16_2_67f50693_for_value local_40;
  
  puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar3 = (lhs_format->unified).sel;
  pdVar4 = (lhs_format->unified).data;
  pdVar5 = rhs_row_locations->data;
  pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar6 = *pvVar8;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar13 = 0;
      iVar11 = 0;
      do {
        iVar10 = iVar11;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar10 = (idx_t)sel->sel_vector[iVar11];
        }
        psVar7 = pSVar3->sel_vector;
        iVar12 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar7[iVar10];
        }
        puVar1 = (undefined8 *)(*(long *)(pdVar5 + iVar10 * 8) + vVar6);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        bVar14 = (1 << ((byte)col_idx & 7) &
                 (uint)*(byte *)(*(long *)(pdVar5 + iVar10 * 8) + (col_idx >> 3))) != 0;
        if (bVar14) {
          bVar14 = string_t::operator==
                             ((string_t *)(pdVar4 + iVar12 * 0x10),(string_t *)&local_40.pointer);
        }
        if (bVar14 != false) {
          sel->sel_vector[iVar13] = (sel_t)iVar10;
          iVar13 = iVar13 + 1;
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
      return iVar13;
    }
  }
  else if (count != 0) {
    iVar13 = 0;
    iVar11 = 0;
    do {
      iVar10 = iVar11;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)sel->sel_vector[iVar11];
      }
      psVar7 = pSVar3->sel_vector;
      iVar12 = iVar10;
      if (psVar7 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar7[iVar10];
      }
      puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = (puVar2[iVar12 >> 6] >> (iVar12 & 0x3f) & 1) == 0;
      }
      uVar9 = (uint)*(byte *)(*(long *)(pdVar5 + iVar10 * 8) + (col_idx >> 3)) &
              1 << ((byte)col_idx & 7);
      puVar1 = (undefined8 *)(*(long *)(pdVar5 + iVar10 * 8) + vVar6);
      local_40._0_8_ = *puVar1;
      local_40.pointer.ptr = (char *)puVar1[1];
      if ((bVar14 == false) && (uVar9 != 0)) {
        bVar14 = string_t::operator==
                           ((string_t *)(pdVar4 + iVar12 * 0x10),(string_t *)&local_40.pointer);
      }
      else {
        bVar14 = (bool)(bVar14 ^ uVar9 == 0 ^ 1);
      }
      if (bVar14 != false) {
        sel->sel_vector[iVar13] = (sel_t)iVar10;
        iVar13 = iVar13 + 1;
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
    return iVar13;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}